

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_mscomplex.cpp
# Opt level: O2

void __thiscall
trimesh::merge_dag_t::get_contrib_cps
          (merge_dag_t *this,vector<int,_std::allocator<int>_> *l,eGDIR dir,int cp,int res)

{
  int i;
  node_t *pnVar1;
  size_type sVar2;
  _Elt_pointer piVar3;
  size_type sVar4;
  int g;
  node_t gnode;
  stack<int,_std::deque<int,_std::allocator<int>_>_> stk;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  uint local_d0;
  int local_cc;
  undefined8 local_c8;
  int local_c0;
  vector<int,_std::allocator<int>_> *local_b8;
  _Deque_base<int,_std::allocator<int>_> local_b0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  pnVar1 = (node_t *)
           (this->m_cp_geom[dir].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + cp);
  local_b8 = l;
  while( true ) {
    i = pnVar1->base;
    local_cc = i;
    pnVar1 = get_node(this,i);
    if (pnVar1->canc_no < res) break;
    pnVar1 = get_node(this,i);
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&local_b0);
  std::deque<int,_std::allocator<int>_>::push_back
            ((deque<int,_std::allocator<int>_> *)&local_b0,&local_cc);
  while( true ) {
    sVar2 = std::deque<int,_std::allocator<int>_>::size
                      ((deque<int,_std::allocator<int>_> *)&local_b0);
    if (sVar2 == 0) break;
    piVar3 = local_b0._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (local_b0._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_b0._M_impl.super__Deque_impl_data._M_finish._M_first) {
      piVar3 = local_b0._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    local_d0 = piVar3[-1];
    std::deque<int,_std::allocator<int>_>::pop_back((deque<int,_std::allocator<int>_> *)&local_b0);
    sVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_60,
                       (key_type *)&local_d0);
    if (sVar4 == 0) {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_60,(int *)&local_d0);
      if ((int)local_d0 < 0) {
        local_c8 = CONCAT44(local_c8._4_4_,~local_d0);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_b8,(int *)&local_c8);
      }
      pnVar1 = get_node(this,local_d0);
      local_c0 = pnVar1->canc_no;
      local_c8._0_4_ = pnVar1->base;
      local_c8._4_4_ = pnVar1->other;
      if ((undefined4)local_c8 != -1) {
        std::deque<int,_std::allocator<int>_>::push_back
                  ((deque<int,_std::allocator<int>_> *)&local_b0,(value_type_conflict2 *)&local_c8);
        std::deque<int,_std::allocator<int>_>::push_back
                  ((deque<int,_std::allocator<int>_> *)&local_b0,
                   (value_type_conflict2 *)((long)&local_c8 + 4));
      }
    }
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_b0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return;
}

Assistant:

void merge_dag_t::get_contrib_cps
(std::vector<int> &l, eGDIR dir,int cp,int res) const
{
  int g = m_cp_geom[dir][cp];

  while(get_node(g).canc_no >= res )
    g = get_node(g).base;

  std::set<int>    visited;

  std::stack<int> stk;

  stk.push(g);

  while(stk.size() != 0 )
  {
    int g = stk.top();
    stk.pop();

    if(visited.count(g) != 0 )
      continue;

    visited.insert(g);

    if( g < 0)
      l.push_back(-g-1);

    node_t gnode = get_node(g);

    if(gnode.base != -1)
    {
      stk.push(gnode.base);
      stk.push(gnode.other);
    }
  }
}